

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O0

long Centaurus::Context<char>::callback
               (SymbolEntry *symbol,uint64_t *values,int num_values,void *context)

{
  ulong uVar1;
  size_type sVar2;
  reference pp_Var3;
  void *pvVar4;
  undefined1 local_58 [8];
  SymbolContext<char> rc;
  ParseContext<char> *ctx;
  void *context_local;
  int num_values_local;
  uint64_t *values_local;
  SymbolEntry *symbol_local;
  
  rc._24_8_ = context;
  SymbolContext<char>::SymbolContext
            ((SymbolContext<char> *)local_58,(ParseContext<char> *)context,symbol,values,num_values)
  ;
  uVar1 = symbol->id;
  sVar2 = std::
          vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
          ::size(*(vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
                   **)rc._24_8_);
  if ((uVar1 < sVar2) &&
     (pp_Var3 = std::
                vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
                ::operator[](*(vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
                               **)rc._24_8_,symbol->id), *pp_Var3 != (value_type)0x0)) {
    pp_Var3 = std::
              vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
              ::operator[](*(vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
                             **)rc._24_8_,symbol->id);
    pvVar4 = (**pp_Var3)((SymbolContext<char> *)local_58);
    return (long)pvVar4;
  }
  return 0;
}

Assistant:

static long CENTAURUS_CALLBACK callback(const SymbolEntry *symbol, uint64_t *values, int num_values, void *context)
  {
    auto& ctx = *reinterpret_cast<ParseContext<TCHAR>*>(context);
    SymbolContext<TCHAR> rc(ctx, *symbol, values, num_values);
    if (symbol->id < ctx.m_callbacks.size() &&
        ctx.m_callbacks[symbol->id] != nullptr)
      return (long)ctx.m_callbacks[symbol->id](rc);
    return 0;
  }